

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

int * parasail_result_get_score_table(parasail_result_t *result)

{
  char *pcVar1;
  char *__format;
  
  if (result == (parasail_result_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar1 = "result";
  }
  else {
    if (((uint)result->flag >> 0x11 & 1) != 0) {
      if ((~result->flag & 0x30000U) == 0) {
        return *((result->field_4).trace)->trace_del_table;
      }
      return (int *)((result->field_4).trace)->trace_table;
    }
    __format = "%s: assert(%s) failed\n";
    pcVar1 = "parasail_result_is_table(result) || parasail_result_is_stats_table(result)";
  }
  fprintf(_stderr,__format,"parasail_result_get_score_table",pcVar1);
  return (int *)0x0;
}

Assistant:

int* parasail_result_get_score_table(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_table(result) || parasail_result_is_stats_table(result));
    if (parasail_result_is_stats_table(result)) {
        return result->stats->tables->score_table;
    }
    if (parasail_result_is_table(result)) {
        return result->tables->score_table;
    }
    return NULL; /* should not reach */
}